

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * google::protobuf::anon_unknown_1::ToCamelCase
                   (string *__return_storage_ptr__,string *input,bool lower_first)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  int local_30;
  int i;
  byte local_1a;
  bool capitalize_next;
  bool lower_first_local;
  string *input_local;
  string *result;
  
  local_1a = ~lower_first & 1;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_30 = 0; uVar2 = std::__cxx11::string::size(), (ulong)(long)local_30 < uVar2;
      local_30 = local_30 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if (*pcVar3 == '_') {
      local_1a = 1;
    }
    else if (local_1a == 0) {
      std::__cxx11::string::operator[]((ulong)input);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
      ToUpper(*pcVar3);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      local_1a = 0;
    }
  }
  if ((lower_first) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    cVar1 = ToLower(*pcVar3);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pcVar3 = cVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

string ToCamelCase(const string& input, bool lower_first) {
  bool capitalize_next = !lower_first;
  string result;
  result.reserve(input.size());

  for (int i = 0; i < input.size(); i++) {
    if (input[i] == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpper(input[i]));
      capitalize_next = false;
    } else {
      result.push_back(input[i]);
    }
  }

  // Lower-case the first letter.
  if (lower_first && !result.empty()) {
    result[0] = ToLower(result[0]);
  }

  return result;
}